

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# family_test.cc
# Opt level: O3

void __thiscall
prometheus::anon_unknown_0::FamilyTest_reject_histogram_with_constant_le_label_Test::TestBody
          (FamilyTest_reject_histogram_with_constant_le_label_Test *this)

{
  bool bVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  Labels labels;
  allocator_type local_89;
  AssertHelper local_88;
  long *local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            (&local_78,(char (*) [3])0x180a0b,(char (*) [5])0x17f890);
  __l._M_len = 1;
  __l._M_array = &local_78;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_38,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_88,&local_89);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.second._M_dataplus._M_p != &local_78.second.field_2) {
    operator_delete(local_78.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
    operator_delete(local_78.first._M_dataplus._M_p);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      detail::
      make_unique<prometheus::Family<prometheus::Histogram>,char_const(&)[5],char_const(&)[5],std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&>
                ((detail *)&local_80,(char (*) [5])0x18248f,(char (*) [5])0x1861b9,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_38);
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      local_80 = (long *)0x0;
    }
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/family_test.cc"
             ,0x7b,
             "Expected: detail::make_unique<Family<Histogram>>(\"name\", \"help\", labels) throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((long *)local_78.first._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_78.first._M_dataplus._M_p + 8))();
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_38);
  return;
}

Assistant:

TEST(FamilyTest, reject_histogram_with_constant_le_label) {
  auto labels = Labels{{"le", "test"}};
  EXPECT_ANY_THROW(
      detail::make_unique<Family<Histogram>>("name", "help", labels));
}